

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

void __thiscall
jsonnet::internal::anon_unknown_0::Stack::newCall
          (Stack *this,LocationRange *loc,HeapEntity *context,HeapObject *self,uint offset,
          BindingFrame *up_values)

{
  bool bVar1;
  allocator<char> *__a;
  Frame *pFVar2;
  ostream *poVar3;
  UString *in_RCX;
  HeapEntity *in_RDX;
  char *in_RSI;
  long in_RDI;
  uint in_R8D;
  undefined8 in_R9;
  pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>
  *bind;
  const_iterator __end3;
  const_iterator __begin3;
  BindingFrame *__range3;
  string *in_stack_000000a8;
  LocationRange *in_stack_000000b0;
  Stack *in_stack_000000b8;
  map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
  *in_stack_fffffffffffffef8;
  LocationRange *in_stack_ffffffffffffff00;
  string *psVar4;
  FrameKind *in_stack_ffffffffffffff08;
  Stack *in_stack_ffffffffffffff10;
  UString *s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string local_b0 [32];
  reference local_90;
  _Self local_88;
  _Self local_80;
  undefined8 local_78;
  undefined4 local_6c;
  undefined1 local_65;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_51;
  undefined8 local_30;
  uint local_24;
  UString *local_20;
  HeapEntity *local_18;
  char *local_10;
  
  local_30 = in_R9;
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  tailCallTrimStack(in_stack_ffffffffffffff10);
  if (*(uint *)(in_RDI + 0xc) <= *(uint *)(in_RDI + 8)) {
    local_65 = 1;
    __a = (allocator<char> *)__cxa_allocate_exception(0x38);
    this_00 = &local_51;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_00,local_10,__a);
    makeError(in_stack_000000b8,in_stack_000000b0,in_stack_000000a8);
    local_65 = 0;
    __cxa_throw(__a,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
  }
  local_6c = 6;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Frame,std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>>
  ::
  emplace_back<jsonnet::internal::(anonymous_namespace)::FrameKind,jsonnet::internal::LocationRange_const&>
            ((vector<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
              *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  *(int *)(in_RDI + 8) = *(int *)(in_RDI + 8) + 1;
  pFVar2 = top((Stack *)0x2dcb06);
  pFVar2->context = local_18;
  pFVar2 = top((Stack *)0x2dcb29);
  pFVar2->self = (HeapObject *)local_20;
  pFVar2 = top((Stack *)0x2dcb4a);
  pFVar2->offset = local_24;
  top((Stack *)0x2dcb6b);
  std::
  map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
  ::operator=((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
               *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  pFVar2 = top((Stack *)0x2dcb89);
  pFVar2->tailCall = false;
  local_78 = local_30;
  local_80._M_node =
       (_Base_ptr)
       std::
       map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
       ::begin(in_stack_fffffffffffffef8);
  local_88._M_node =
       (_Base_ptr)
       std::
       map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
       ::end(in_stack_fffffffffffffef8);
  s = local_20;
  while( true ) {
    bVar1 = std::operator!=(&local_80,&local_88);
    if (!bVar1) {
      return;
    }
    local_90 = std::
               _Rb_tree_const_iterator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
               ::operator*((_Rb_tree_const_iterator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                            *)in_stack_ffffffffffffff00);
    if (local_90->second == (HeapThunk *)0x0) break;
    std::
    _Rb_tree_const_iterator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                  *)in_stack_ffffffffffffff00);
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"INTERNAL ERROR: No binding for variable ");
  psVar4 = local_b0;
  encode_utf8(s);
  poVar3 = std::operator<<(poVar3,psVar4);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_b0);
  abort();
}

Assistant:

void newCall(const LocationRange &loc, HeapEntity *context, HeapObject *self, unsigned offset,
                 const BindingFrame &up_values)
    {
        tailCallTrimStack();
        if (calls >= limit) {
            throw makeError(loc, "max stack frames exceeded.");
        }
        stack.emplace_back(FRAME_CALL, loc);
        calls++;
        top().context = context;
        top().self = self;
        top().offset = offset;
        top().bindings = up_values;
        top().tailCall = false;

#ifndef NDEBUG
        for (const auto &bind : up_values) {
            if (bind.second == nullptr) {
                std::cerr << "INTERNAL ERROR: No binding for variable "
                          << encode_utf8(bind.first->name) << std::endl;
                std::abort();
            }
        }
#endif
    }